

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

void __thiscall ON_Viewport::GetViewScale(ON_Viewport *this,double *x,double *y,double *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  
  if (x != (double *)0x0) {
    *x = 1.0;
  }
  if (y != (double *)0x0) {
    *y = 1.0;
  }
  if (z != (double *)0x0) {
    *z = 1.0;
  }
  bVar5 = ON_Xform::IsIdentity(&this->m_clip_mods,0.0);
  if (((((!bVar5) && (dVar1 = (this->m_clip_mods).m_xform[3][0], dVar1 == 0.0)) && (!NAN(dVar1))) &&
      ((dVar1 = (this->m_clip_mods).m_xform[3][1], dVar1 == 0.0 && (!NAN(dVar1))))) &&
     (((dVar1 = (this->m_clip_mods).m_xform[3][2], dVar1 == 0.0 &&
       ((!NAN(dVar1) && (dVar1 = (this->m_clip_mods).m_xform[3][3], dVar1 == 1.0)))) &&
      (!NAN(dVar1))))) {
    dVar1 = (this->m_clip_mods).m_xform[0][0];
    if (((((2.3283064365386963e-10 < ABS(dVar1)) &&
          (dVar2 = (this->m_clip_mods).m_xform[1][1], 2.3283064365386963e-10 < ABS(dVar2))) &&
         (dVar3 = (this->m_clip_mods).m_xform[2][2], 2.3283064365386963e-10 < ABS(dVar3))) &&
        (((dVar4 = (this->m_clip_mods).m_xform[0][1], dVar4 == 0.0 && (!NAN(dVar4))) &&
         ((dVar4 = (this->m_clip_mods).m_xform[0][2], dVar4 == 0.0 &&
          ((!NAN(dVar4) && (dVar4 = (this->m_clip_mods).m_xform[1][0], dVar4 == 0.0)))))))) &&
       ((!NAN(dVar4) && ((dVar4 = (this->m_clip_mods).m_xform[1][2], dVar4 == 0.0 && (!NAN(dVar4))))
        ))) {
      if (x != (double *)0x0) {
        *x = dVar1;
      }
      if (y != (double *)0x0) {
        *y = dVar2;
      }
      if (z != (double *)0x0) {
        *z = dVar3;
      }
    }
  }
  return;
}

Assistant:

void ON_Viewport::GetViewScale( double* x, double* y, double* z) const
{
  if (x) *x = 1.0;
  if (y) *y = 1.0;
  if (z) *z = 1.0;
  if ( !m_clip_mods.IsIdentity()
       && 0.0 == m_clip_mods.m_xform[3][0]
       && 0.0 == m_clip_mods.m_xform[3][1]
       && 0.0 == m_clip_mods.m_xform[3][2]
       && 1.0 == m_clip_mods.m_xform[3][3]
     )
  {
    // 04 May 2020 S. Baer (RH-37076)
    // Allow for negative scale values. See comments in SetViewScale
    double sx = m_clip_mods.m_xform[0][0];
    double sy = m_clip_mods.m_xform[1][1];
    double sz = m_clip_mods.m_xform[2][2];
    if (    fabs(sx) > ON_ZERO_TOLERANCE
         && fabs(sy) > ON_ZERO_TOLERANCE
         && fabs(sz) > ON_ZERO_TOLERANCE
         && 0.0 == m_clip_mods.m_xform[0][1]
         && 0.0 == m_clip_mods.m_xform[0][2]
         && 0.0 == m_clip_mods.m_xform[1][0]
         && 0.0 == m_clip_mods.m_xform[1][2]
      )
    {
      if (x) *x = sx;
      if (y) *y = sy;
      if (z) *z = sz;
    }
  }
}